

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O0

void af_glyph_hints_done(AF_GlyphHints hints)

{
  FT_Memory memory_00;
  AF_AxisHintsRec *pAVar1;
  AF_AxisHints axis;
  int dim;
  FT_Memory memory;
  AF_GlyphHints hints_local;
  
  if ((hints != (AF_GlyphHints)0x0) && (hints->memory != (FT_Memory)0x0)) {
    memory_00 = hints->memory;
    for (axis._4_4_ = 0; axis._4_4_ < 2; axis._4_4_ = axis._4_4_ + 1) {
      pAVar1 = hints->axis + axis._4_4_;
      pAVar1->num_segments = 0;
      pAVar1->max_segments = 0;
      if ((anon_struct_2496_2_23da31ad_for_embedded *)pAVar1->segments != &pAVar1->embedded) {
        ft_mem_free(memory_00,pAVar1->segments);
        pAVar1->segments = (AF_Segment_conflict)0x0;
      }
      pAVar1->num_edges = 0;
      pAVar1->max_edges = 0;
      if (pAVar1->edges != (pAVar1->embedded).edges) {
        ft_mem_free(memory_00,pAVar1->edges);
        pAVar1->edges = (AF_Edge_conflict)0x0;
      }
    }
    if ((anon_struct_7744_2_b586ae8f_for_embedded *)hints->contours != &hints->embedded) {
      ft_mem_free(memory_00,hints->contours);
      hints->contours = (AF_Point_conflict *)0x0;
    }
    hints->max_contours = 0;
    hints->num_contours = 0;
    if (hints->points != (hints->embedded).points) {
      ft_mem_free(memory_00,hints->points);
      hints->points = (AF_Point_conflict)0x0;
    }
    hints->max_points = 0;
    hints->num_points = 0;
    hints->memory = (FT_Memory)0x0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_glyph_hints_done( AF_GlyphHints  hints )
  {
    FT_Memory  memory;
    int        dim;


    if ( !( hints && hints->memory ) )
      return;

    memory = hints->memory;

    /*
     * note that we don't need to free the segment and edge
     * buffers since they are really within the hints->points array
     */
    for ( dim = 0; dim < AF_DIMENSION_MAX; dim++ )
    {
      AF_AxisHints  axis = &hints->axis[dim];


      axis->num_segments = 0;
      axis->max_segments = 0;
      if ( axis->segments != axis->embedded.segments )
        FT_FREE( axis->segments );

      axis->num_edges = 0;
      axis->max_edges = 0;
      if ( axis->edges != axis->embedded.edges )
        FT_FREE( axis->edges );
    }

    if ( hints->contours != hints->embedded.contours )
      FT_FREE( hints->contours );
    hints->max_contours = 0;
    hints->num_contours = 0;

    if ( hints->points != hints->embedded.points )
      FT_FREE( hints->points );
    hints->max_points = 0;
    hints->num_points = 0;

    hints->memory = NULL;
  }